

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

char * getPathWithoutFinalSlash(char *aoDestination,char *aSource)

{
  char *in_RSI;
  char *in_RDI;
  char *lTmp;
  char *local_18;
  
  if (in_RSI == (char *)0x0) {
    *in_RDI = '\0';
  }
  else {
    local_18 = strrchr(in_RSI,0x2f);
    if (local_18 == (char *)0x0) {
      local_18 = strrchr(in_RSI,0x5c);
    }
    if (local_18 == (char *)0x0) {
      *in_RDI = '\0';
    }
    else {
      strncpy(in_RDI,in_RSI,(long)local_18 - (long)in_RSI);
      in_RDI[(long)local_18 - (long)in_RSI] = '\0';
    }
  }
  return in_RDI;
}

Assistant:

static char * getPathWithoutFinalSlash(
        char * aoDestination, /* make sure it is allocated, use _MAX_PATH */
        char const * aSource) /* aoDestination and aSource can be the same */
{
        char const * lTmp ;
        if ( aSource )
        {
                lTmp = strrchr(aSource, '/');
                if (!lTmp)
                {
                        lTmp = strrchr(aSource, '\\');
                }
                if (lTmp)
                {
                        strncpy(aoDestination, aSource, lTmp - aSource );
                        aoDestination[lTmp - aSource] = '\0';
                }
                else
                {
                        * aoDestination = '\0';
                }
        }
        else
        {
                * aoDestination = '\0';
        }
        return aoDestination;
}